

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O2

void __thiscall
license::License::License(License *this,string *licenseName,string *project_folder,bool base64)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  logic_error *this_00;
  string *this_01;
  path normalized;
  path rproject_path;
  string rproject_path_str;
  path local_b0;
  path local_90;
  path local_70;
  path local_50;
  
  this->_vptr_License = (_func_int **)&PTR__License_0054cb40;
  (this->m_private_key)._M_dataplus._M_p = (pointer)&(this->m_private_key).field_2;
  (this->m_private_key)._M_string_length = 0;
  (this->m_private_key).field_2._M_local_buf[0] = '\0';
  (this->m_feature_names)._M_dataplus._M_p = (pointer)&(this->m_feature_names).field_2;
  (this->m_feature_names)._M_string_length = 0;
  (this->m_feature_names).field_2._M_local_buf[0] = '\0';
  this->m_base64 = base64;
  this->m_license_fname = licenseName;
  std::__cxx11::string::string((string *)&rproject_path,(string *)project_folder);
  bVar2 = boost::filesystem::exists(&rproject_path);
  if (bVar2) {
    bVar2 = boost::filesystem::is_directory(&rproject_path);
    if (bVar2) {
      normalized.m_pathname._M_dataplus._M_p = (pointer)&normalized.m_pathname.field_2;
      normalized.m_pathname._M_string_length = 0;
      normalized.m_pathname.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)&rproject_path_str,(string *)&rproject_path);
      bVar2 = std::operator==(&rproject_path.m_pathname,".");
      if (bVar2) {
        boost::filesystem::current_path();
        std::__cxx11::string::operator=((string *)&normalized,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        boost::filesystem::current_path();
        boost::filesystem::operator/(&local_b0,&local_50,&rproject_path);
        boost::filesystem::current_path();
        boost::filesystem::canonical(&local_90,&local_b0,&local_70);
        std::__cxx11::string::operator=((string *)&normalized,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
        this_01 = (string *)&local_50;
      }
      else {
        boost::filesystem::current_path();
        boost::filesystem::canonical(&local_90,&rproject_path,&local_b0);
        std::__cxx11::string::operator=((string *)&normalized,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        this_01 = (string *)&local_b0;
      }
      std::__cxx11::string::~string(this_01);
      std::__cxx11::string::string((string *)&this->m_project_folder,(string *)&normalized);
      std::__cxx11::string::~string((string *)&rproject_path_str);
      std::__cxx11::string::~string((string *)&normalized);
      std::__cxx11::string::~string((string *)&rproject_path);
      p_Var1 = &(this->values_map)._M_t._M_impl.super__Rb_tree_header;
      (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      std::__cxx11::string::string((string *)&rproject_path,(string *)&this->m_project_folder);
      boost::filesystem::path::filename();
      std::__cxx11::string::_M_assign((string *)&this->m_feature_names);
      std::__cxx11::string::~string((string *)&normalized);
      boost::filesystem::path::path((path *)&rproject_path_str,"private_key.rsa");
      boost::filesystem::operator/(&normalized,&rproject_path,(path *)&rproject_path_str);
      std::__cxx11::string::_M_assign((string *)&this->m_private_key);
      std::__cxx11::string::~string((string *)&normalized);
      std::__cxx11::string::~string((string *)&rproject_path_str);
      std::__cxx11::string::~string((string *)&rproject_path);
      return;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&rproject_path_str,"Path ",project_folder);
  std::operator+(&normalized.m_pathname,&rproject_path_str," doesn\'t exist or is not a directory.")
  ;
  std::logic_error::logic_error(this_00,(string *)&normalized);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

License::License(const std::string *licenseName, const std::string &project_folder, bool base64)
	: m_base64(base64), m_license_fname(licenseName), m_project_folder(normalize_project_path(project_folder)) {
	fs::path proj_folder(m_project_folder);
	// default feature = project name
	m_feature_names = proj_folder.filename().string();
	m_private_key = (proj_folder / PRIVATE_KEY_FNAME).string();
}